

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseEventModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  EventModuleField *pEVar2;
  Enum EVar3;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> local_90;
  char *local_88;
  size_type sStack_80;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_78;
  undefined8 uStack_70;
  Token local_68;
  
  RVar1 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    GetToken(&local_68,this);
    local_78.offset = (size_t)local_68.loc.field_1.field_1.offset;
    uStack_70 = local_68.loc.field_1._8_8_;
    local_88 = local_68.loc.filename.data_;
    sStack_80 = local_68.loc.filename.size_;
    pEVar2 = (EventModuleField *)operator_new(0xe0);
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
         = (_func_int **)&PTR__ModuleField_001ab2e8;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.filename.data_
         = local_88;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.filename.size_
         = sStack_80;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.field_1.
    field_1.offset = local_78.offset;
    *(undefined8 *)
     ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
             field_1 + 8) = uStack_70;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.type_ = Event;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
         = (_func_int **)&PTR__EventModuleField_001ab950;
    Event::Event(&pEVar2->event,(string_view)ZEXT816(0));
    RVar1 = Expect(this,Event);
    EVar3 = Error;
    if (RVar1.enum_ != Error) {
      ParseBindVarOpt(this,&(pEVar2->event).name);
      RVar1 = ParseTypeUseOpt(this,&(pEVar2->event).decl);
      if (RVar1.enum_ != Error) {
        RVar1 = ParseUnboundFuncSignature(this,&(pEVar2->event).decl.sig);
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_90._M_head_impl = pEVar2;
            Module::AppendField(module,(unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                                        *)&local_90);
            if (local_90._M_head_impl != (EventModuleField *)0x0) {
              (*((local_90._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_90._M_head_impl = (EventModuleField *)0x0;
            EVar3 = Ok;
            pEVar2 = (EventModuleField *)0x0;
          }
        }
      }
    }
    if (pEVar2 != (EventModuleField *)0x0) {
      (*(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
        _vptr_ModuleField[1])(pEVar2);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseEventModuleField(Module* module) {
  WABT_TRACE(ParseEventModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<EventModuleField>(GetLocation());
  EXPECT(Event);
  ParseBindVarOpt(&field->event.name);
  CHECK_RESULT(ParseTypeUseOpt(&field->event.decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&field->event.decl.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}